

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O1

int run_test_stdio_over_pipes(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  long lVar2;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  size_t *psVar3;
  code *process_00;
  char *pcVar4;
  uv_pipe_t *loop_00;
  uv_stdio_container_t stdio [2];
  uv_process_t process;
  uv_stdio_container_t local_c8;
  undefined4 local_b8;
  uv_pipe_t *local_b0;
  uv_process_t local_a0;
  
  ::loop = uv_default_loop();
  psVar3 = &exepath_size;
  pcVar4 = exepath;
  iVar1 = uv_exepath(exepath,&exepath_size);
  if (iVar1 == 0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = "stdio_over_pipes_helper";
    args[2] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = exit_cb;
    uv_pipe_init(::loop,&out,0);
    uv_pipe_init(::loop,&in,0);
    local_c8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    local_c8.data.stream = (uv_stream_t *)&in;
    local_b8 = 0x21;
    local_b0 = &out;
    options.stdio_count = 2;
    process_00 = (code *)&local_a0;
    loop_00 = (uv_pipe_t *)::loop;
    options.stdio = &local_c8;
    iVar1 = uv_spawn(::loop,(uv_process_t *)process_00,&options);
    if (iVar1 != 0) goto LAB_0016cd91;
    loop_00 = &out;
    process_00 = on_alloc;
    iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016cd96;
    loop_00 = (uv_pipe_t *)uv_default_loop();
    process_00 = (code *)0x0;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016cd9b;
    if (on_read_cb_called < 2) goto LAB_0016cda0;
    if (after_write_cb_called != 1) goto LAB_0016cda5;
    if (exit_cb_called != 1) goto LAB_0016cdaa;
    if (close_cb_called != 3) goto LAB_0016cdaf;
    if (output._8_4_ != 0xa646c72 || output._0_8_ != 0x6f77206f6c6c6568) goto LAB_0016cdb4;
    if (output_used == 0xc) {
      loop = uv_default_loop();
      uv_walk(loop,close_walk_cb,(void *)0x0);
      process_00 = (code *)0x0;
      uv_run(loop,UV_RUN_DEFAULT);
      loop_00 = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016cdbe;
    }
  }
  else {
    run_test_stdio_over_pipes_cold_1();
    process_00 = (code *)psVar3;
    loop_00 = (uv_pipe_t *)pcVar4;
LAB_0016cd91:
    run_test_stdio_over_pipes_cold_2();
LAB_0016cd96:
    run_test_stdio_over_pipes_cold_3();
LAB_0016cd9b:
    run_test_stdio_over_pipes_cold_4();
LAB_0016cda0:
    run_test_stdio_over_pipes_cold_5();
LAB_0016cda5:
    run_test_stdio_over_pipes_cold_6();
LAB_0016cdaa:
    run_test_stdio_over_pipes_cold_7();
LAB_0016cdaf:
    run_test_stdio_over_pipes_cold_8();
LAB_0016cdb4:
    run_test_stdio_over_pipes_cold_9();
  }
  run_test_stdio_over_pipes_cold_10();
LAB_0016cdbe:
  run_test_stdio_over_pipes_cold_11();
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_process_t *)process_00 == (uv_process_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      uv_close((uv_handle_t *)&in,close_cb);
      uv_close((uv_handle_t *)&out,close_cb);
      return extraout_EAX;
    }
  }
  else {
    exit_cb_cold_1();
  }
  exit_cb_cold_2();
  iVar1 = output_used;
  lVar2 = (long)output_used;
  *extraout_RDX = output + lVar2;
  extraout_RDX[1] = 0x400 - lVar2;
  return iVar1;
}

Assistant:

TEST_IMPL(stdio_over_pipes) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[2];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(loop, &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(on_read_cb_called > 1);
  ASSERT(after_write_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);
  ASSERT(memcmp("hello world\n", output, 12) == 0);
  ASSERT(output_used == 12);

  MAKE_VALGRIND_HAPPY();
  return 0;
}